

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_settop(lua_State *L,int idx)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  StkId level;
  ulong uVar4;
  
  if (idx < 0) {
    uVar3 = (ulong)(idx + 1);
  }
  else {
    lVar2 = (long)(L->ci->func).p + ((ulong)(uint)idx * 0x10 - (L->top).offset) + 0x10;
    uVar3 = lVar2 >> 4;
    for (uVar4 = uVar3; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
      lVar1 = (L->top).offset;
      (L->top).p = (StkId)(lVar1 + 0x10);
      *(undefined1 *)(lVar1 + 8) = 0;
    }
    uVar3 = lVar2 >> 0x3f & uVar3;
  }
  level = (L->top).p + uVar3;
  if (((long)uVar3 < 0) && (level <= (L->tbclist).p)) {
    level = luaF_close(L,level,-1,0);
  }
  (L->top).p = level;
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  CallInfo *ci;
  StkId func, newtop;
  ptrdiff_t diff;  /* difference for new top */
  lua_lock(L);
  ci = L->ci;
  func = ci->func.p;
  if (idx >= 0) {
    api_check(L, idx <= ci->top.p - (func + 1), "new top too large");
    diff = ((func + 1) + idx) - L->top.p;
    for (; diff > 0; diff--)
      setnilvalue(s2v(L->top.p++));  /* clear new slots */
  }
  else {
    api_check(L, -(idx+1) <= (L->top.p - (func + 1)), "invalid new top");
    diff = idx + 1;  /* will "subtract" index (as it is negative) */
  }
  api_check(L, L->tbclist.p < L->top.p, "previous pop of an unclosed slot");
  newtop = L->top.p + diff;
  if (diff < 0 && L->tbclist.p >= newtop) {
    lua_assert(hastocloseCfunc(ci->nresults));
    newtop = luaF_close(L, newtop, CLOSEKTOP, 0);
  }
  L->top.p = newtop;  /* correct top only after closing any upvalue */
  lua_unlock(L);
}